

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# schema-loader.c++
# Opt level: O2

void __thiscall
capnp::SchemaLoader::CompatibilityChecker::checkDefaultCompatibility
          (CompatibilityChecker *this,Reader *value,Reader *replacement)

{
  uint uVar1;
  uint uVar2;
  undefined2 *puVar3;
  undefined4 uVar4;
  Which WVar5;
  char *condition;
  Which WVar6;
  int iVar7;
  DebugComparison<capnp::schema::Value::Which,_capnp::schema::Value::Which> _kjCondition;
  Fault f;
  
  uVar1 = (value->_reader).dataSize;
  if (uVar1 < 0x10) {
    WVar5 = VOID;
  }
  else {
    WVar5 = *(value->_reader).data;
  }
  uVar2 = (replacement->_reader).dataSize;
  if (uVar2 < 0x10) {
    WVar6 = VOID;
  }
  else {
    WVar6 = *(replacement->_reader).data;
  }
  uVar4 = _kjCondition._4_4_;
  _kjCondition.right = WVar6;
  _kjCondition.left = WVar5;
  _kjCondition.op.content.ptr = " == ";
  _kjCondition.op.content.size_ = 5;
  _kjCondition.result = WVar5 == WVar6;
  if (WVar5 != WVar6) {
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<capnp::schema::Value::Which,capnp::schema::Value::Which>&>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x4a7,FAILED,"value.which() == replacement.which()","_kjCondition,",&_kjCondition);
    goto LAB_0019f096;
  }
  if (uVar1 < 0x10) {
    return;
  }
  puVar3 = (undefined2 *)(value->_reader).data;
  switch(*puVar3) {
  case 1:
    if (uVar1 == 0x10) {
      _kjCondition.left._0_1_ = 0;
    }
    else {
      _kjCondition.left._0_1_ = *(byte *)(puVar3 + 1) & 1;
    }
    if (uVar2 < 0x11) {
      _kjCondition.left._1_1_ = 0;
    }
    else {
      _kjCondition.left._1_1_ = *(byte *)((long)(replacement->_reader).data + 2) & 1;
    }
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = (undefined1)_kjCondition.left == _kjCondition.left._1_1_;
    if ((undefined1)_kjCondition.left == _kjCondition.left._1_1_) {
      return;
    }
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<bool,bool>&,char_const(&)[22]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x4b2,FAILED,"value.getBool() == replacement.getBool()",
               "_kjCondition,\"default value changed\"",(DebugComparison<bool,_bool> *)&_kjCondition
               ,(char (*) [22])"default value changed");
    break;
  case 2:
    if (uVar1 < 0x18) {
      _kjCondition.left._0_1_ = '\0';
    }
    else {
      _kjCondition.left._0_1_ = *(undefined1 *)(puVar3 + 1);
    }
    if (uVar2 < 0x18) {
      _kjCondition.left._1_1_ = '\0';
    }
    else {
      _kjCondition.left._1_1_ = *(char *)((long)(replacement->_reader).data + 2);
    }
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = (undefined1)_kjCondition.left == _kjCondition.left._1_1_;
    if ((undefined1)_kjCondition.left == _kjCondition.left._1_1_) {
      return;
    }
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<signed_char,signed_char>&,char_const(&)[22]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x4b3,FAILED,"value.getInt8() == replacement.getInt8()",
               "_kjCondition,\"default value changed\"",
               (DebugComparison<signed_char,_signed_char> *)&_kjCondition,
               (char (*) [22])"default value changed");
    break;
  case 3:
    if (uVar1 < 0x20) {
      _kjCondition.left = VOID;
    }
    else {
      _kjCondition.left = puVar3[1];
    }
    if (uVar2 < 0x20) {
      _kjCondition.right = VOID;
    }
    else {
      _kjCondition.right = *(Which *)((long)(replacement->_reader).data + 2);
    }
    _kjCondition._0_8_ = CONCAT44(uVar4,_kjCondition._0_4_);
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = _kjCondition.left == _kjCondition.right;
    if (_kjCondition.left == _kjCondition.right) {
      return;
    }
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<short,short>&,char_const(&)[22]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x4b4,FAILED,"value.getInt16() == replacement.getInt16()",
               "_kjCondition,\"default value changed\"",
               (DebugComparison<short,_short> *)&_kjCondition,(char (*) [22])"default value changed"
              );
    break;
  case 4:
    _kjCondition._4_4_ = 0;
    iVar7 = 0;
    if (0x3f < uVar1) {
      iVar7 = *(int *)(puVar3 + 2);
    }
    if (0x3f < uVar2) {
      _kjCondition._4_4_ = *(int *)((long)(replacement->_reader).data + 4);
    }
    _kjCondition.left = (short)iVar7;
    _kjCondition.right = (short)((uint)iVar7 >> 0x10);
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = iVar7 == _kjCondition._4_4_;
    if (iVar7 == _kjCondition._4_4_) {
      return;
    }
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<int,int>&,char_const(&)[22]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x4b5,FAILED,"value.getInt32() == replacement.getInt32()",
               "_kjCondition,\"default value changed\"",(DebugComparison<int,_int> *)&_kjCondition,
               (char (*) [22])"default value changed");
    break;
  case 5:
    if (uVar1 < 0x80) {
      _kjCondition._0_8_ = (char *)0x0;
    }
    else {
      _kjCondition._0_8_ = *(undefined8 *)(puVar3 + 4);
    }
    if (uVar2 < 0x80) {
      _kjCondition.op.content.ptr = (char *)0x0;
    }
    else {
      _kjCondition.op.content.ptr = *(char **)((long)(replacement->_reader).data + 8);
    }
    _kjCondition.op.content.size_ = (long)"() {\n  return which() == " + 0x15;
    _kjCondition.result = true;
    _kjCondition._25_7_ = 0;
    if ((char *)_kjCondition._0_8_ == _kjCondition.op.content.ptr) {
      return;
    }
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<long,long>&,char_const(&)[22]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x4b6,FAILED,"value.getInt64() == replacement.getInt64()",
               "_kjCondition,\"default value changed\"",(DebugComparison<long,_long> *)&_kjCondition
               ,(char (*) [22])"default value changed");
    break;
  case 6:
    if (uVar1 < 0x18) {
      _kjCondition.left._0_1_ = '\0';
    }
    else {
      _kjCondition.left._0_1_ = *(undefined1 *)(puVar3 + 1);
    }
    if (uVar2 < 0x18) {
      _kjCondition.left._1_1_ = '\0';
    }
    else {
      _kjCondition.left._1_1_ = *(char *)((long)(replacement->_reader).data + 2);
    }
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = (undefined1)_kjCondition.left == _kjCondition.left._1_1_;
    if ((undefined1)_kjCondition.left == _kjCondition.left._1_1_) {
      return;
    }
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_char,unsigned_char>&,char_const(&)[22]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x4b7,FAILED,"value.getUint8() == replacement.getUint8()",
               "_kjCondition,\"default value changed\"",
               (DebugComparison<unsigned_char,_unsigned_char> *)&_kjCondition,
               (char (*) [22])"default value changed");
    break;
  case 7:
    if (uVar1 < 0x20) {
      _kjCondition.left = VOID;
    }
    else {
      _kjCondition.left = puVar3[1];
    }
    if (uVar2 < 0x20) {
      _kjCondition.right = VOID;
    }
    else {
      _kjCondition.right = *(Which *)((long)(replacement->_reader).data + 2);
    }
    _kjCondition.result = _kjCondition.left == _kjCondition.right;
    if (_kjCondition.result) {
      return;
    }
    condition = "value.getUint16() == replacement.getUint16()";
    iVar7 = 0x4b8;
    goto LAB_0019f605;
  case 8:
    _kjCondition._4_4_ = 0;
    iVar7 = 0;
    if (0x3f < uVar1) {
      iVar7 = *(int *)(puVar3 + 2);
    }
    if (0x3f < uVar2) {
      _kjCondition._4_4_ = *(int *)((long)(replacement->_reader).data + 4);
    }
    _kjCondition.left = (short)iVar7;
    _kjCondition.right = (short)((uint)iVar7 >> 0x10);
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = iVar7 == _kjCondition._4_4_;
    if (iVar7 == _kjCondition._4_4_) {
      return;
    }
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_int,unsigned_int>&,char_const(&)[22]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x4b9,FAILED,"value.getUint32() == replacement.getUint32()",
               "_kjCondition,\"default value changed\"",
               (DebugComparison<unsigned_int,_unsigned_int> *)&_kjCondition,
               (char (*) [22])"default value changed");
    break;
  case 9:
    if (uVar1 < 0x80) {
      _kjCondition._0_8_ = (char *)0x0;
    }
    else {
      _kjCondition._0_8_ = *(undefined8 *)(puVar3 + 4);
    }
    if (uVar2 < 0x80) {
      _kjCondition.op.content.ptr = (char *)0x0;
    }
    else {
      _kjCondition.op.content.ptr = *(char **)((long)(replacement->_reader).data + 8);
    }
    _kjCondition.op.content.size_ = (long)"() {\n  return which() == " + 0x15;
    _kjCondition.result = true;
    _kjCondition._25_7_ = 0;
    if ((char *)_kjCondition._0_8_ == _kjCondition.op.content.ptr) {
      return;
    }
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_long,unsigned_long>&,char_const(&)[22]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x4ba,FAILED,"value.getUint64() == replacement.getUint64()",
               "_kjCondition,\"default value changed\"",
               (DebugComparison<unsigned_long,_unsigned_long> *)&_kjCondition,
               (char (*) [22])"default value changed");
    break;
  case 10:
    _kjCondition._4_4_ = 0.0;
    _kjCondition._0_4_ = 0.0;
    if (0x3f < uVar1) {
      _kjCondition._0_4_ = *(undefined4 *)(puVar3 + 2);
    }
    if (0x3f < uVar2) {
      _kjCondition._4_4_ = *(float *)((long)(replacement->_reader).data + 4);
    }
    _kjCondition.op.content.ptr = " == ";
    _kjCondition.op.content.size_ = 5;
    _kjCondition.result = (float)_kjCondition._0_4_ == (float)_kjCondition._4_4_;
    if (((float)_kjCondition._0_4_ == (float)_kjCondition._4_4_) &&
       (!NAN((float)_kjCondition._0_4_) && !NAN((float)_kjCondition._4_4_))) {
      return;
    }
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<float,float>&,char_const(&)[22]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x4bb,FAILED,"value.getFloat32() == replacement.getFloat32()",
               "_kjCondition,\"default value changed\"",
               (DebugComparison<float,_float> *)&_kjCondition,(char (*) [22])"default value changed"
              );
    break;
  case 0xb:
    _kjCondition.op.content.ptr = (char *)0x0;
    _kjCondition._0_8_ = 0.0;
    if (0x7f < uVar1) {
      _kjCondition._0_8_ = *(undefined8 *)(puVar3 + 4);
    }
    if (0x7f < uVar2) {
      _kjCondition.op.content.ptr = *(char **)((long)(replacement->_reader).data + 8);
    }
    _kjCondition.op.content.size_ = (long)"() {\n  return which() == " + 0x15;
    _kjCondition.result = true;
    _kjCondition._25_7_ = 0;
    if (((double)_kjCondition._0_8_ == (double)_kjCondition.op.content.ptr) &&
       (!NAN((double)_kjCondition._0_8_) && !NAN((double)_kjCondition.op.content.ptr))) {
      return;
    }
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<double,double>&,char_const(&)[22]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,0x4bc,FAILED,"value.getFloat64() == replacement.getFloat64()",
               "_kjCondition,\"default value changed\"",
               (DebugComparison<double,_double> *)&_kjCondition,
               (char (*) [22])"default value changed");
    break;
  default:
    goto switchD_0019f050_caseD_c;
  case 0xf:
    if (uVar1 < 0x20) {
      _kjCondition.left = VOID;
    }
    else {
      _kjCondition.left = puVar3[1];
    }
    if (uVar2 < 0x20) {
      _kjCondition.right = VOID;
    }
    else {
      _kjCondition.right = *(Which *)((long)(replacement->_reader).data + 2);
    }
    _kjCondition.result = _kjCondition.left == _kjCondition.right;
    if (_kjCondition.result) {
      return;
    }
    condition = "value.getEnum() == replacement.getEnum()";
    iVar7 = 0x4bd;
LAB_0019f605:
    _kjCondition.left = _kjCondition.left;
    _kjCondition.right = _kjCondition.right;
    _kjCondition._0_8_ = CONCAT44(uVar4,_kjCondition._0_4_);
    _kjCondition.op.content.size_ = 5;
    _kjCondition.op.content.ptr = " == ";
    kj::_::Debug::Fault::
    Fault<kj::Exception::Type,kj::_::DebugComparison<unsigned_short,unsigned_short>&,char_const(&)[22]>
              (&f,
               "/workspace/llm4binary/github/license_c_cmakelists/capnproto[P]capnproto/c++/src/capnp/schema-loader.c++"
               ,iVar7,FAILED,condition,"_kjCondition,\"default value changed\"",
               (DebugComparison<unsigned_short,_unsigned_short> *)&_kjCondition,
               (char (*) [22])"default value changed");
  }
LAB_0019f096:
  this->compatibility = INCOMPATIBLE;
  kj::_::Debug::Fault::~Fault(&f);
switchD_0019f050_caseD_c:
  return;
}

Assistant:

void checkDefaultCompatibility(const schema::Value::Reader& value,
                                 const schema::Value::Reader& replacement) {
    // Note that we test default compatibility only after testing type compatibility, and default
    // values have already been validated as matching their types, so this should pass.
    KJ_ASSERT(value.which() == replacement.which()) {
      compatibility = INCOMPATIBLE;
      return;
    }

    switch (value.which()) {
#define HANDLE_TYPE(discrim, name) \
      case schema::Value::discrim: \
        VALIDATE_SCHEMA(value.get##name() == replacement.get##name(), "default value changed"); \
        break;
      HANDLE_TYPE(VOID, Void);
      HANDLE_TYPE(BOOL, Bool);
      HANDLE_TYPE(INT8, Int8);
      HANDLE_TYPE(INT16, Int16);
      HANDLE_TYPE(INT32, Int32);
      HANDLE_TYPE(INT64, Int64);
      HANDLE_TYPE(UINT8, Uint8);
      HANDLE_TYPE(UINT16, Uint16);
      HANDLE_TYPE(UINT32, Uint32);
      HANDLE_TYPE(UINT64, Uint64);
      HANDLE_TYPE(FLOAT32, Float32);
      HANDLE_TYPE(FLOAT64, Float64);
      HANDLE_TYPE(ENUM, Enum);
#undef HANDLE_TYPE

      case schema::Value::TEXT:
      case schema::Value::DATA:
      case schema::Value::LIST:
      case schema::Value::STRUCT:
      case schema::Value::INTERFACE:
      case schema::Value::ANY_POINTER:
        // It's not a big deal if default values for pointers change, and it would be difficult for
        // us to compare these defaults here, so just let it slide.
        break;
    }
  }